

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O2

float128 commonNaNToFloat128(commonNaNT a,float_status *status)

{
  float128 fVar1;
  
  if (status->default_nan_mode == '\0') {
    fVar1.high = (ulong)(uint)a._0_4_ << 0x3f | a.high >> 0x10 | 0x7fff000000000000;
    fVar1.low = a.low >> 0x10 | a.high << 0x30;
  }
  else {
    fVar1 = float128_default_nan_mips64el(status);
  }
  return fVar1;
}

Assistant:

static float128 commonNaNToFloat128(commonNaNT a, float_status *status)
{
    float128 z;

    if (status->default_nan_mode) {
        return float128_default_nan(status);
    }

    shift128Right(a.high, a.low, 16, &z.high, &z.low);
    z.high |= (((uint64_t)a.sign) << 63) | UINT64_C(0x7FFF000000000000);
    return z;
}